

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::AbsoluteDifference
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Image *pIVar5;
  byte bVar6;
  uchar *puVar7;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uchar *puVar8;
  ulong uVar9;
  undefined4 in_register_0000008c;
  uchar uVar10;
  uchar *puVar11;
  uchar *puVar12;
  uint local_a8;
  uint local_a4;
  Image *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  Image *local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_98 = CONCAT44(in_register_0000008c,startY2);
  local_90 = CONCAT44(in_register_00000014,startY1);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,startY1,in2,startX2,startY2,out,startXOut,startYOut,width,height);
  local_88 = in1;
  bVar6 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in1,in2,out);
  local_a4 = (uint)bVar6;
  local_a8 = width * local_a4;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  local_58._data = (uchar *)0x0;
  local_58._type = in2->_type;
  local_a0 = in2;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in2,src);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
  pIVar5 = local_88;
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_a8,&height,local_88,&local_58,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar2 = out->_rowSize;
  if (height * uVar2 != 0) {
    puVar12 = out->_data + (ulong)(startXOut * local_a4) + (ulong)(startYOut * uVar2);
    uVar3 = local_a0->_rowSize;
    puVar7 = puVar12 + height * uVar2;
    puVar8 = local_a0->_data + (ulong)(startX2 * local_a4) + (ulong)((int)local_98 * uVar3);
    uVar4 = pIVar5->_rowSize;
    puVar11 = pIVar5->_data + (ulong)(startX1 * local_a4) + (ulong)((int)local_90 * uVar4);
    do {
      if ((ulong)local_a8 != 0) {
        uVar9 = 0;
        do {
          bVar6 = puVar11[uVar9];
          bVar1 = puVar8[uVar9];
          uVar10 = -(bVar6 - bVar1);
          if (bVar1 <= bVar6) {
            uVar10 = bVar6 - bVar1;
          }
          puVar12[uVar9] = uVar10;
          uVar9 = uVar9 + 1;
        } while (local_a8 != uVar9);
      }
      puVar12 = puVar12 + uVar2;
      puVar11 = puVar11 + uVar4;
      puVar8 = puVar8 + uVar3;
    } while (puVar12 != puVar7);
  }
  return;
}

Assistant:

void AbsoluteDifference( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                             Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in1, in2, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSize1   = in1.rowSize();
        const uint32_t rowSize2   = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSize1   + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSize2   + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSize1, in2Y += rowSize2 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                (*outX) = static_cast<uint8_t>( (*in2X) > (*in1X) ? (*in2X) - (*in1X) : (*in1X) - (*in2X) );
        }
    }